

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::remove_peer(torrent *this,shared_ptr<libtorrent::aux::peer_connection> *p)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  element_type *peVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  element_type *p_00;
  torrent_peer *peer;
  pointer ppVar6;
  undefined4 extraout_var_01;
  int64_t iVar7;
  undefined4 extraout_var_02;
  pointer this_00;
  undefined1 local_178 [8];
  torrent_state st;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *pieces;
  torrent_peer *pp;
  handler<libtorrent::aux::torrent,_void_(libtorrent::aux::torrent::*)()_noexcept,_&libtorrent::aux::torrent::on_remove_peers,_&libtorrent::aux::torrent::on_error,_&libtorrent::aux::torrent::on_exception,_libtorrent::aux::handler_storage<80UL,_(libtorrent::aux::HandlerName)5>,_&libtorrent::aux::torrent::m_deferred_handler_storage>
  local_a8;
  enable_shared_from_this<libtorrent::aux::torrent> local_98;
  undefined1 local_88 [8];
  weak_ptr<libtorrent::aux::torrent> weak_t;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_68;
  byte local_51;
  iterator iStack_50;
  bool is_attached;
  _Base_ptr local_48;
  _Self local_40;
  key_type local_34;
  _Self local_20;
  iterator it;
  shared_ptr<libtorrent::aux::peer_connection> *p_local;
  torrent *this_local;
  undefined4 extraout_var_00;
  
  it._M_node = (_Base_ptr)p;
  peVar4 = ::std::
           __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)p);
  (*(peVar4->super_peer_connection_interface)._vptr_peer_connection_interface[6])
            (&local_34,&peVar4->super_peer_connection_interface);
  local_20._M_node =
       (_Base_ptr)
       ::std::
       set<libtorrent::digest32<160L>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<libtorrent::digest32<160L>_>_>
       ::find(&this->m_outgoing_pids,&local_34);
  local_40._M_node =
       (_Base_ptr)
       ::std::
       set<libtorrent::digest32<160L>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<libtorrent::digest32<160L>_>_>
       ::end(&this->m_outgoing_pids);
  bVar1 = ::std::operator!=(&local_20,&local_40);
  if (bVar1) {
    local_48 = local_20._M_node;
    iStack_50 = ::std::
                set<libtorrent::digest32<160l>,std::less<libtorrent::digest32<160l>>,std::allocator<libtorrent::digest32<160l>>>
                ::erase_abi_cxx11_((set<libtorrent::digest32<160l>,std::less<libtorrent::digest32<160l>>,std::allocator<libtorrent::digest32<160l>>>
                                    *)&this->m_outgoing_pids,local_20._M_node);
  }
  ::std::
  __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)p);
  peer_connection::associated_torrent
            ((peer_connection *)
             &weak_t.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::weak_ptr<libtorrent::aux::torrent>::lock((weak_ptr<libtorrent::aux::torrent> *)&local_68);
  peVar5 = ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::get(&local_68)
  ;
  bVar1 = peVar5 == this;
  ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
            ((shared_ptr<libtorrent::aux::torrent> *)&local_68);
  ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
            ((weak_ptr<libtorrent::aux::torrent> *)
             &weak_t.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  local_51 = bVar1;
  if (bVar1) {
    ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this(&local_98);
    ::std::weak_ptr<libtorrent::aux::torrent>::weak_ptr<libtorrent::aux::torrent,void>
              ((weak_ptr<libtorrent::aux::torrent> *)local_88,
               (shared_ptr<libtorrent::aux::torrent> *)&local_98);
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)&local_98);
    ::std::
    vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
    ::push_back(&this->m_peers_to_disconnect,p);
    iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [7])();
    ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
              ((enable_shared_from_this<libtorrent::aux::torrent> *)&pp);
    handler<libtorrent::aux::torrent,_void_(libtorrent::aux::torrent::*)()_noexcept,_&libtorrent::aux::torrent::on_remove_peers,_&libtorrent::aux::torrent::on_error,_&libtorrent::aux::torrent::on_exception,_libtorrent::aux::handler_storage<80UL,_(libtorrent::aux::HandlerName)5>,_&libtorrent::aux::torrent::m_deferred_handler_storage>
    ::handler(&local_a8,(shared_ptr<libtorrent::aux::torrent> *)&pp);
    deferred_handler::
    post_deferred<libtorrent::aux::handler<libtorrent::aux::torrent,void(libtorrent::aux::torrent::*)()noexcept,&libtorrent::aux::torrent::on_remove_peers,&libtorrent::aux::torrent::on_error,&libtorrent::aux::torrent::on_exception,libtorrent::aux::handler_storage<80ul,(libtorrent::aux::HandlerName)5>,&libtorrent::aux::torrent::m_deferred_handler_storage>>
              (&this->m_deferred_disconnect,(io_context *)CONCAT44(extraout_var,iVar2),&local_a8);
    handler<libtorrent::aux::torrent,_void_(libtorrent::aux::torrent::*)()_noexcept,_&libtorrent::aux::torrent::on_remove_peers,_&libtorrent::aux::torrent::on_error,_&libtorrent::aux::torrent::on_exception,_libtorrent::aux::handler_storage<80UL,_(libtorrent::aux::HandlerName)5>,_&libtorrent::aux::torrent::m_deferred_handler_storage>
    ::~handler(&local_a8);
    ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
              ((shared_ptr<libtorrent::aux::torrent> *)&pp);
    ::std::weak_ptr<libtorrent::aux::torrent>::~weak_ptr
              ((weak_ptr<libtorrent::aux::torrent> *)local_88);
  }
  else {
    p_00 = ::std::__shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>::get
                     (&p->
                       super___shared_ptr<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2>
                     );
    remove_connection(this,p_00);
  }
  peVar4 = ::std::
           __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)p);
  iVar2 = (*(peVar4->super_bandwidth_socket)._vptr_bandwidth_socket[7])();
  peer = (torrent_peer *)CONCAT44(extraout_var_00,iVar2);
  bVar1 = ready_for_connections(this);
  if ((bVar1) && (bVar1 = has_picker(this), bVar1)) {
    peVar4 = ::std::
             __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)p);
    bVar1 = peer_connection::is_seed(peVar4);
    if (bVar1) {
      ppVar6 = ::std::
               unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ::operator->(&(this->super_torrent_hot_members).m_picker);
      piece_picker::dec_refcount_all(ppVar6,peer);
    }
    else {
      peVar4 = ::std::
               __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)p);
      st.erased.
      super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)peer_connection::get_bitfield(peVar4);
      ppVar6 = ::std::
               unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
               ::operator->(&(this->super_torrent_hot_members).m_picker);
      piece_picker::dec_refcount
                (ppVar6,(typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
                         *)st.erased.
                           super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,peer);
    }
  }
  peVar4 = ::std::
           __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)p);
  uVar3 = (*(peVar4->super_bandwidth_socket)._vptr_bandwidth_socket[0xc])();
  if ((uVar3 & 1) == 0) {
    peVar4 = ::std::
             __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)p);
    bVar1 = peer_connection::ignore_unchoke_slots(peVar4);
    if (!bVar1) {
      *(uint *)&this->field_0x5d8 =
           *(uint *)&this->field_0x5d8 & 0xff000000 |
           (*(uint *)&this->field_0x5d8 & 0xffffff) - 1 & 0xffffff;
      trigger_unchoke(this);
    }
  }
  if (peer != (torrent_peer *)0x0) {
    if ((*(uint *)&peer->field_0x1b >> 6 & 1) != 0) {
      *(uint *)&peer->field_0x1b = *(uint *)&peer->field_0x1b & 0xffffffbf;
      counters::inc_stats_counter(this->m_stats_counters,0xea,-1);
      trigger_optimistic_unchoke(this);
    }
    peVar4 = ::std::
             __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)p);
    iVar2 = (*(peVar4->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])();
    iVar7 = stat::total_payload_download((stat *)CONCAT44(extraout_var_01,iVar2));
    if (iVar7 < 0) {
      iVar7 = iVar7 + 0x3ff;
    }
    uVar3 = numeric_cast<unsigned_int,long,void>(iVar7 >> 10);
    peer->prev_amount_download = peer->prev_amount_download + uVar3;
    peVar4 = ::std::
             __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)p);
    iVar2 = (*(peVar4->super_bandwidth_socket)._vptr_bandwidth_socket[0xe])();
    iVar7 = stat::total_payload_upload((stat *)CONCAT44(extraout_var_02,iVar2));
    if (iVar7 < 0) {
      iVar7 = iVar7 + 0x3ff;
    }
    uVar3 = numeric_cast<unsigned_int,long,void>(iVar7 >> 10);
    peer->prev_amount_upload = uVar3 + peer->prev_amount_upload;
    if (((local_51 & 1) != 0) && ((*(uint *)&peer->field_0x1b >> 7 & 1) != 0)) {
      this->m_num_seeds = this->m_num_seeds - 1;
    }
    if ((peer->connection != (peer_connection_interface *)0x0) &&
       (bVar1 = ::std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr *)&(this->super_torrent_hot_members).m_peer_list), bVar1)) {
      get_peer_list_state((torrent_state *)local_178,this);
      this_00 = ::std::
                unique_ptr<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                ::operator->(&(this->super_torrent_hot_members).m_peer_list);
      peVar4 = ::std::
               __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)p);
      uVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0xf])();
      peer_list::connection_closed
                (this_00,&peVar4->super_peer_connection_interface,uVar3 & 0xffff,
                 (torrent_state *)local_178);
      peers_erased(this,(vector<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
                         *)&st.port);
      torrent_state::~torrent_state((torrent_state *)local_178);
    }
  }
  peVar4 = ::std::
           __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)p);
  (*(peVar4->super_bandwidth_socket)._vptr_bandwidth_socket[6])(peVar4,0);
  update_want_peers(this);
  update_want_tick(this);
  return;
}

Assistant:

void torrent::remove_peer(std::shared_ptr<peer_connection> p) noexcept
	{
		TORRENT_ASSERT(p);
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(std::count(m_peers_to_disconnect.begin()
			, m_peers_to_disconnect.end(), p) == 0);

		auto it = m_outgoing_pids.find(p->our_pid());
		if (it != m_outgoing_pids.end())
		{
			m_outgoing_pids.erase(it);
		}

		// only schedule the peer for actual removal if in fact
		// we can be sure peer_connection will be kept alive until
		// the deferred function is called. If a peer_connection
		// has not associated torrent, the session_impl object may
		// remove it at any time, which may be while the non-owning
		// pointer in m_peers_to_disconnect (if added to it) is
		// waiting for the deferred function to be called.
		//
		// one example of this situation is if for example, this
		// function is called from the attach_peer path and fail to
		// do so because of too many connections.
		bool const is_attached = p->associated_torrent().lock().get() == this;
		if (is_attached)
		{
			std::weak_ptr<torrent> weak_t = shared_from_this();
			TORRENT_ASSERT_VAL(m_peers_to_disconnect.capacity() > m_peers_to_disconnect.size()
				, m_peers_to_disconnect.capacity());
			m_peers_to_disconnect.push_back(p);

			using deferred_handler_type = aux::handler<
				torrent
				, decltype(&torrent::on_remove_peers)
				, &torrent::on_remove_peers
				, &torrent::on_error
				, &torrent::on_exception
				, decltype(m_deferred_handler_storage)
				, &torrent::m_deferred_handler_storage
				>;
			static_assert(sizeof(deferred_handler_type) == sizeof(std::shared_ptr<peer_connection>)
				, "deferred handler does not have the expected size");
			m_deferred_disconnect.post_deferred(m_ses.get_context(), deferred_handler_type(shared_from_this()));
		}
		else
		{
			// if the peer was inserted in m_connections but instructed to
			// be removed from this torrent, just remove it from it, see
			// attach_peer logic.
			remove_connection(p.get());
		}

		torrent_peer* pp = p->peer_info_struct();
		if (ready_for_connections())
		{
			TORRENT_ASSERT(p->associated_torrent().lock().get() == nullptr
				|| p->associated_torrent().lock().get() == this);

			if (has_picker())
			{
				if (p->is_seed())
				{
					m_picker->dec_refcount_all(pp);
				}
				else
				{
					auto const& pieces = p->get_bitfield();
					TORRENT_ASSERT(pieces.count() <= pieces.size());
					m_picker->dec_refcount(pieces, pp);
				}
			}
		}

		if (!p->is_choked() && !p->ignore_unchoke_slots())
		{
			--m_num_uploads;
			trigger_unchoke();
		}

		if (pp)
		{
			if (pp->optimistically_unchoked)
			{
				pp->optimistically_unchoked = false;
				m_stats_counters.inc_stats_counter(
					counters::num_peers_up_unchoked_optimistic, -1);
				trigger_optimistic_unchoke();
			}

			TORRENT_ASSERT(pp->prev_amount_upload == 0);
			TORRENT_ASSERT(pp->prev_amount_download == 0);
			pp->prev_amount_download += aux::numeric_cast<std::uint32_t>(p->statistics().total_payload_download() / 1024);
			pp->prev_amount_upload += aux::numeric_cast<std::uint32_t>(p->statistics().total_payload_upload() / 1024);

			// only decrement the seed count if the peer completed attaching to the torrent
			// otherwise the seed count did not get incremented for this peer
			if (is_attached && pp->seed)
			{
				TORRENT_ASSERT(m_num_seeds > 0);
				--m_num_seeds;
			}

			if (pp->connection && m_peer_list)
			{
				torrent_state st = get_peer_list_state();
				m_peer_list->connection_closed(*p, m_ses.session_time(), &st);
				peers_erased(st.erased);
			}
		}

		p->set_peer_info(nullptr);

		update_want_peers();
		update_want_tick();
	}